

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse_document_end(yaml_parser_t *parser,yaml_event_t *event)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  yaml_tag_directive_t *pyVar4;
  yaml_char_t *ptr;
  int iVar5;
  bool bVar6;
  yaml_token_t *local_78;
  yaml_tag_directive_t tag_directive;
  size_t sStack_58;
  int implicit;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_token_t *token;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  if (parser->token_available == 0) {
    iVar5 = yaml_parser_fetch_more_tokens(parser);
    if (iVar5 == 0) {
      local_78 = (yaml_token_t *)0x0;
      goto LAB_00114a4b;
    }
  }
  local_78 = (parser->tokens).head;
LAB_00114a4b:
  if (local_78 == (yaml_token_t *)0x0) {
    parser_local._4_4_ = 0;
  }
  else {
    sVar1 = (local_78->start_mark).index;
    sVar2 = (local_78->start_mark).line;
    sVar3 = (local_78->start_mark).column;
    bVar6 = local_78->type == YAML_DOCUMENT_END_TOKEN;
    sStack_58 = sVar1;
    end_mark.index = sVar2;
    end_mark.line = sVar3;
    if (bVar6) {
      sStack_58 = (local_78->end_mark).index;
      end_mark.index = (local_78->end_mark).line;
      end_mark.line = (local_78->end_mark).column;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = (parser->tokens).head + 1;
    }
    tag_directive.prefix._5_3_ = 0;
    tag_directive.prefix._4_1_ = !bVar6;
    while ((parser->tag_directives).start != (parser->tag_directives).top) {
      pyVar4 = (parser->tag_directives).top;
      (parser->tag_directives).top = pyVar4 + -1;
      ptr = pyVar4[-1].prefix;
      yaml_free(pyVar4[-1].handle);
      yaml_free(ptr);
    }
    parser->state = YAML_PARSE_DOCUMENT_START_STATE;
    memset(event,0,0x68);
    event->type = YAML_DOCUMENT_END_EVENT;
    (event->start_mark).index = sVar1;
    (event->start_mark).line = sVar2;
    (event->start_mark).column = sVar3;
    (event->end_mark).index = sStack_58;
    (event->end_mark).line = end_mark.index;
    (event->end_mark).column = end_mark.line;
    *(uint *)&event->data = tag_directive.prefix._4_4_;
    parser_local._4_4_ = 1;
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_parse_document_end(yaml_parser_t *parser, yaml_event_t *event)
{
    yaml_token_t *token;
    yaml_mark_t start_mark, end_mark;
    int implicit = 1;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    start_mark = end_mark = token->start_mark;

    if (token->type == YAML_DOCUMENT_END_TOKEN) {
        end_mark = token->end_mark;
        SKIP_TOKEN(parser);
        implicit = 0;
    }

    while (!STACK_EMPTY(parser, parser->tag_directives)) {
        yaml_tag_directive_t tag_directive = POP(parser, parser->tag_directives);
        yaml_free(tag_directive.handle);
        yaml_free(tag_directive.prefix);
    }

    parser->state = YAML_PARSE_DOCUMENT_START_STATE;
    DOCUMENT_END_EVENT_INIT(*event, implicit, start_mark, end_mark);

    return 1;
}